

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O3

int __thiscall
tchecker::typed_while_statement_t::clone
          (typed_while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_statement_t *ptVar2;
  typed_while_statement_t *this_00;
  shared_ptr<const_tchecker::typed_statement_t> stmt_clone;
  shared_ptr<const_tchecker::typed_expression_t> cond_clone;
  shared_ptr<const_tchecker::typed_statement_t> local_30;
  shared_ptr<const_tchecker::typed_expression_t> local_20;
  
  ptVar1 = condition(this);
  local_20.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar1 + 0x28))(ptVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_expression_t*>
            (&local_20.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_20.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  ptVar2 = statement(this);
  local_30.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(**(code **)(*(long *)ptVar2 + 0x28))(ptVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::typed_statement_t*>
            (&local_30.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_30.
             super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (typed_while_statement_t *)operator_new(0x38);
  typed_while_statement_t(this_00,(this->super_typed_statement_t)._type,&local_20,&local_30);
  if (local_30.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (int)this_00;
}

Assistant:

tchecker::typed_while_statement_t * typed_while_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> cond_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_statement_t const> stmt_clone{statement().clone()};
  return new tchecker::typed_while_statement_t(_type, cond_clone, stmt_clone);
}